

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O2

void notify_children(__cilkrts_worker *w,uint msg)

{
  int iVar1;
  __cilkrts_worker *p_Var2;
  signal_node_t *psVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = w->g->P + -1;
  iVar1 = w->self;
  iVar6 = iVar1 * 2 + 1;
  if (iVar5 <= iVar6) {
    return;
  }
  p_Var2 = w->g->workers[iVar6];
  if (p_Var2 == (__cilkrts_worker *)0x0) {
    do {
    } while( true );
  }
  psVar3 = p_Var2->l->signal_node;
  if (psVar3 == (signal_node_t *)0x0) {
    uVar4 = 0x6c8;
  }
  else {
    signal_node_msg(psVar3,msg);
    iVar6 = iVar1 * 2 + 2;
    if (iVar5 <= iVar6) {
      return;
    }
    p_Var2 = w->g->workers[iVar6];
    if (p_Var2 == (__cilkrts_worker *)0x0) {
      do {
      } while( true );
    }
    psVar3 = p_Var2->l->signal_node;
    if (psVar3 != (signal_node_t *)0x0) {
      signal_node_msg(psVar3,msg);
      return;
    }
    uVar4 = 0x6cf;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,uVar4,"child->l->signal_node");
}

Assistant:

static void notify_children(__cilkrts_worker *w, unsigned int msg)
{
    int child_num;
    __cilkrts_worker *child;
    int num_sys_workers = w->g->P - 1;

    // If worker is "n", then its children are 2n + 1, and 2n + 2.
    child_num = (w->self << 1) + 1;
    if (child_num < num_sys_workers) {
        do {
            child = w->g->workers[child_num];
        } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
        CILK_ASSERT(child->l->signal_node);
        signal_node_msg(child->l->signal_node, msg);
        child_num++;
        if (child_num < num_sys_workers) {
            do {
                child = w->g->workers[child_num];
            } while (child == NULL); /* at the begining, busy waiting until the worker is initialized */
            CILK_ASSERT(child->l->signal_node);
            signal_node_msg(child->l->signal_node, msg);
        }
    }
}